

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O2

void __thiscall
google::protobuf::io::AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo>::AddAnnotation
          (AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *this,size_t begin_offset,
          size_t end_offset,string *file_path,vector<int,_std::allocator<int>_> *path)

{
  pointer piVar1;
  GeneratedCodeInfo_Annotation *this_00;
  int i;
  ulong uVar2;
  
  this_00 = RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation>::Add
                      (&this->annotation_proto_->annotation_);
  for (uVar2 = 0;
      piVar1 = (path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
               ._M_start,
      uVar2 < (ulong)((long)(path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar1 >> 2);
      uVar2 = uVar2 + 1) {
    GeneratedCodeInfo_Annotation::add_path(this_00,piVar1[uVar2]);
  }
  GeneratedCodeInfo_Annotation::set_source_file(this_00,file_path);
  this_00->begin_ = (int32)begin_offset;
  *(byte *)(this_00->_has_bits_).has_bits_ = (byte)(this_00->_has_bits_).has_bits_[0] | 6;
  this_00->end_ = (int32)end_offset;
  return;
}

Assistant:

virtual void AddAnnotation(size_t begin_offset, size_t end_offset,
                             const string& file_path,
                             const std::vector<int>& path) {
    typename AnnotationProto::Annotation* annotation =
        annotation_proto_->add_annotation();
    for (int i = 0; i < path.size(); ++i) {
      annotation->add_path(path[i]);
    }
    annotation->set_source_file(file_path);
    annotation->set_begin(begin_offset);
    annotation->set_end(end_offset);
  }